

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall mario::TcpServer::removeConnectionInLoop(TcpServer *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  Writer *pWVar1;
  _Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()> local_c0;
  code *local_a0;
  undefined8 local_98;
  Writer local_90;
  
  EventLoop::assertInLoopThread(this->_loop);
  local_90._vptr_Writer = (_func_int **)&PTR__Writer_00135bd0;
  local_90.m_msg = (LogMessage *)0x0;
  local_90.m_level = Info;
  local_90.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TcpServer.cpp"
  ;
  local_90.m_line = 0x52;
  local_90.m_func = "void mario::TcpServer::removeConnectionInLoop(const TcpConnectionPtr &)";
  local_90.m_verboseLevel = 0;
  local_90.m_logger = (Logger *)0x0;
  local_90.m_proceed = false;
  local_90.m_messageBuilder.m_logger = (Logger *)0x0;
  local_90.m_messageBuilder.m_containerLogSeperator = "";
  local_90.m_dispatchAction = NormalLog;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar1 = el::base::Writer::construct(&local_90,1,"default");
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [36])"TcpServer::removeConnectionInLoop [")
  ;
  pWVar1 = el::base::Writer::operator<<(pWVar1,&this->_name);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [16])"] - connection ");
  el::base::Writer::operator<<
            (pWVar1,&((conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->_name);
  el::base::Writer::~Writer(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mario::TcpConnection>_>_>_>
  ::erase(&(this->_connections)._M_t,
          &((conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           _name);
  this_00 = ((conn->super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _loop;
  local_a0 = TcpConnection::connectDestroyed;
  local_98 = 0;
  std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>::
  _Bind<std::shared_ptr<mario::TcpConnection>const&>
            ((_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()> *)
             &local_c0,(offset_in_TcpConnection_to_subr *)&local_a0,conn);
  std::function<void()>::
  function<std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>,void>
            ((function<void()> *)&local_90,&local_c0);
  EventLoop::queueInLoop(this_00,(Functor *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_c0._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<mario::TcpConnection>_>.
                     super__Head_base<0UL,_std::shared_ptr<mario::TcpConnection>,_false>.
                     _M_head_impl.
                     super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2> + 8));
  return;
}

Assistant:

void TcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn) {
    _loop->assertInLoopThread();
    LOG(INFO) << "TcpServer::removeConnectionInLoop [" << _name << "] - connection " << conn->name();
    _connections.erase(conn->name());
    EventLoop* ioLoop = conn->getLoop();
    ioLoop->queueInLoop(
            std::bind(&TcpConnection::connectDestroyed, conn)
            );
}